

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O3

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  lua_CFunction *pp_Var1;
  byte bVar2;
  lua_CFunction p_Var3;
  StkId pTVar4;
  uint uVar5;
  int iVar6;
  TValue *pTVar7;
  CallInfo *pCVar8;
  uint uVar9;
  StkId base;
  StkId pTVar10;
  long lVar11;
  long lVar12;
  StkId pTVar13;
  
  uVar5 = func->tt_;
  while( true ) {
    pTVar13 = L->stack;
    uVar5 = uVar5 & 0x3f;
    if (uVar5 == 6) {
      lVar12 = (long)func - (long)pTVar13;
      lVar11 = *(long *)((func->value_).f + 0x18);
      pTVar10 = L->top;
      if ((long)L->stack_last - (long)pTVar10 >> 4 <= (long)(ulong)*(byte *)(lVar11 + 0x7a)) {
        luaD_growstack(L,(uint)*(byte *)(lVar11 + 0x7a));
        pTVar10 = L->top;
        pTVar13 = L->stack;
      }
      pTVar13 = (StkId)((long)pTVar13 + lVar12);
      bVar2 = *(byte *)(lVar11 + 0x78);
      uVar5 = (uint)bVar2;
      iVar6 = (int)((ulong)((long)pTVar10 - (long)pTVar13) >> 4);
      if ((int)(uint)bVar2 < iVar6) {
        uVar9 = iVar6 - 1;
      }
      else {
        iVar6 = (uVar5 - iVar6) + 1;
        do {
          pTVar10->tt_ = 0;
          pTVar10 = pTVar10 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        L->top = pTVar10;
        uVar9 = uVar5;
      }
      if (*(char *)(lVar11 + 0x79) == '\0') {
        pTVar10 = pTVar13 + 1;
      }
      else if (uVar5 != 0) {
        lVar12 = 0;
        do {
          pTVar4 = L->top;
          L->top = pTVar4 + 1;
          pTVar4->value_ = *(Value *)((long)&pTVar10[-(ulong)uVar9].value_ + lVar12);
          pTVar4->tt_ = *(int *)((long)&pTVar10[-(ulong)uVar9].tt_ + lVar12);
          *(undefined4 *)((long)&pTVar10[-(ulong)uVar9].tt_ + lVar12) = 0;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)bVar2 << 4 != lVar12);
      }
      pCVar8 = L->ci->next;
      if (pCVar8 == (CallInfo *)0x0) {
        pCVar8 = luaE_extendCI(L);
      }
      L->ci = pCVar8;
      pCVar8->nresults = (short)nresults;
      pCVar8->func = pTVar13;
      (pCVar8->u).l.base = pTVar10;
      bVar2 = *(byte *)(lVar11 + 0x7a);
      pCVar8->top = pTVar10 + bVar2;
      (pCVar8->u).l.savedpc = *(Instruction **)(lVar11 + 0x18);
      pCVar8->callstatus = '\x01';
      L->top = pTVar10 + bVar2;
      if ((L->hookmask & 1) != 0) {
        pp_Var1 = &(pCVar8->u).c.k;
        *pp_Var1 = *pp_Var1 + 4;
        iVar6 = 0;
        if (((pCVar8->previous->callstatus & 1) != 0) &&
           ((*(uint *)((pCVar8->previous->u).c.k + -4) & 0x3f) == 0x1e)) {
          pCVar8->callstatus = 'A';
          iVar6 = 4;
        }
        luaD_hook(L,iVar6,-1);
        pp_Var1 = &(pCVar8->u).c.k;
        *pp_Var1 = *pp_Var1 + -4;
      }
      return 0;
    }
    pTVar7 = func;
    if (uVar5 == 0x16) break;
    if (uVar5 == 0x26) {
      pTVar7 = (TValue *)((func->value_).f + 0x18);
      break;
    }
    pTVar7 = luaT_gettmbyobj(L,func,TM_CALL);
    if ((pTVar7->tt_ & 0xfU) != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar10 = L->stack;
    pTVar13 = L->top;
    if (func < pTVar13) {
      do {
        pTVar13->value_ = pTVar13[-1].value_;
        pTVar13->tt_ = pTVar13[-1].tt_;
        pTVar13 = pTVar13 + -1;
      } while (func < pTVar13);
      pTVar13 = L->top;
    }
    L->top = pTVar13 + 1;
    if ((long)L->stack_last - (long)(pTVar13 + 1) < 0x10) {
      luaD_growstack(L,0);
    }
    lVar11 = (long)func - (long)pTVar10;
    pTVar13 = L->stack;
    *(Value *)((long)pTVar13 + lVar11) = pTVar7->value_;
    uVar5 = pTVar7->tt_;
    *(uint *)((long)pTVar13 + lVar11 + 8) = uVar5;
    func = (StkId)(lVar11 + (long)pTVar13);
  }
  p_Var3 = (pTVar7->value_).f;
  if ((long)L->stack_last - (long)L->top < 0x150) {
    luaD_growstack(L,0x14);
  }
  pCVar8 = L->ci->next;
  if (pCVar8 == (CallInfo *)0x0) {
    pCVar8 = luaE_extendCI(L);
  }
  L->ci = pCVar8;
  pCVar8->nresults = (short)nresults;
  pCVar8->func = (StkId)(((long)func - (long)pTVar13) + (long)L->stack);
  pCVar8->top = L->top + 0x14;
  pCVar8->callstatus = '\0';
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar6 = (*p_Var3)(L);
  luaD_poscall(L,L->top + -(long)iVar6);
  return 1;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  int n;  /* number of arguments (Lua) or returns (C) */
  ptrdiff_t funcr = savestack(L, func);
  switch (ttype(func)) {
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
      goto Cfunc;
    case LUA_TCCL: {  /* C closure */
      f = clCvalue(func)->f;
     Cfunc:
      luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = restorestack(L, funcr);
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, L->top - n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      luaD_checkstack(L, p->maxstacksize);
      func = restorestack(L, funcr);
      n = cast_int(L->top - func) - 1;  /* number of real arguments */
      for (; n < p->numparams; n++)
        setnilvalue(L->top++);  /* complete missing arguments */
      base = (!p->is_vararg) ? func + 1 : adjust_varargs(L, p, n);
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      ci->top = base + p->maxstacksize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      L->top = ci->top;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* retry with 'function' tag method */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}